

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void helper_fxtract_x86_64(CPUX86State *env)

{
  undefined2 uVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  ushort uVar5;
  FPReg *pFVar6;
  uint64_t uVar7;
  floatx80 fVar8;
  
  uVar3 = env->fpstt;
  pFVar6 = env->fpregs + uVar3;
  uVar7 = (pFVar6->d).low;
  uVar5 = *(ushort *)((long)env->fpregs + (ulong)uVar3 * 0x10 + 8);
  uVar1 = *(undefined2 *)((long)env->fpregs + (ulong)uVar3 * 0x10 + 0xe);
  uVar2 = *(undefined4 *)((long)env->fpregs + (ulong)uVar3 * 0x10 + 10);
  if (((uVar5 & 0x7fff) == 0) && (uVar7 == 0)) {
    uVar7 = 0;
    fVar8._8_8_ = 0xbfff;
    fVar8.low = 0x8000000000000000;
    fVar8 = floatx80_div_x86_64(fVar8,(floatx80)ZEXT816(0),&env->fp_status);
    (pFVar6->d).low = fVar8.low;
    *(uint16_t *)((long)env->fpregs + (ulong)uVar3 * 0x10 + 8) = fVar8.high;
    uVar3 = env->fpstt - 1 & 7;
    env->fptags[uVar3] = '\0';
  }
  else {
    fVar8 = int32_to_floatx80_x86_64((uVar5 & 0x7fff) - 0x3fff,&env->fp_status);
    (pFVar6->d).low = fVar8.low;
    *(uint16_t *)((long)env->fpregs + (ulong)uVar3 * 0x10 + 8) = fVar8.high;
    uVar3 = env->fpstt - 1 & 7;
    env->fptags[uVar3] = '\0';
    uVar5 = uVar5 & 0x8000 | 0x3fff;
  }
  uVar4 = (ulong)(uVar3 << 4);
  *(uint64_t *)((long)env->fpregs + uVar4) = uVar7;
  *(ushort *)((long)env->fpregs + uVar4 + 8) = uVar5;
  *(undefined4 *)((long)env->fpregs + uVar4 + 10) = uVar2;
  *(undefined2 *)((long)env->fpregs + uVar4 + 0xe) = uVar1;
  env->fpstt = uVar3;
  return;
}

Assistant:

void helper_fxtract(CPUX86State *env)
{
    CPU_LDoubleU temp;

    temp.d = ST0;

    if (floatx80_is_zero(ST0)) {
        /* Easy way to generate -inf and raising division by 0 exception */
        floatx80 zero = { 0x0000000000000000LL, 0x0000 };
        floatx80 one  = { 0x8000000000000000LL, 0x3fff };
        ST0 = floatx80_div(floatx80_chs(one), zero,
                           &env->fp_status);
        fpush(env);
        ST0 = temp.d;
    } else {
        int expdif;

        expdif = EXPD(temp) - EXPBIAS;
        /* DP exponent bias */
        ST0 = int32_to_floatx80(expdif, &env->fp_status);
        fpush(env);
        BIASEXPONENT(temp);
        ST0 = temp.d;
    }
}